

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  bool bVar1;
  CTypeID CVar2;
  int iVar3;
  CPscl CVar4;
  CTypeID CVar5;
  long in_RDI;
  CType *tct;
  CTypeID fieldid_1;
  CType *ct_1;
  CTSize bsz;
  CTypeID fieldid;
  CType *ct;
  CTypeID ctypeid;
  CPscl scl;
  CPDecl decl;
  int lastdecl;
  CTypeID lastid;
  CTypeID sid;
  CType *ct_2;
  undefined4 in_stack_fffffffffffff838;
  CPToken in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  uint in_stack_fffffffffffff844;
  CPDecl *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  CTypeID in_stack_fffffffffffff854;
  CPDecl *in_stack_fffffffffffff858;
  int in_stack_fffffffffffff860;
  CTypeID in_stack_fffffffffffff864;
  long local_798;
  CTInfo in_stack_fffffffffffff878;
  CTypeID in_stack_fffffffffffff87c;
  CPDeclIdx in_stack_fffffffffffff880;
  uint32_t in_stack_fffffffffffff884;
  GCstr *local_770;
  CPDecl *in_stack_fffffffffffff898;
  CTypeID in_stack_fffffffffffff8a0;
  uint in_stack_fffffffffffff8a4;
  uint local_104;
  CPDecl *local_e8;
  
  CVar2 = cp_struct_name((CPState *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                         in_stack_fffffffffffff848,in_stack_fffffffffffff844);
  iVar3 = cp_opt((CPState *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),0);
  if (iVar3 != 0) {
    bVar1 = false;
    local_104 = CVar2;
    while (*(int *)(in_RDI + 4) != 0x7d) {
      CVar4 = cp_decl_spec((CPState *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                           in_stack_fffffffffffff858,in_stack_fffffffffffff854);
      in_stack_fffffffffffff884 = 0xe;
      local_e8 = in_stack_fffffffffffff848;
      if (CVar4 != 0) {
        in_stack_fffffffffffff884 = 4;
      }
      while( true ) {
        if (bVar1) {
          cp_err_token((CPState *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       in_stack_fffffffffffff83c);
        }
        cp_declarator((CPState *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                      local_e8);
        CVar5 = cp_decl_intern((CPState *)
                               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                               in_stack_fffffffffffff898);
        if ((CVar4 & 0x20000) == 0) {
          in_stack_fffffffffffff860 = 0x7f;
          in_stack_fffffffffffff854 =
               lj_ctype_new((CTState *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850)
                            ,(CType **)local_e8);
          for (local_e8 = (CPDecl *)(**(long **)(in_RDI + 0x40) + (ulong)CVar5 * 0x10);
              local_e8->top >> 0x1c == 8;
              local_e8 = (CPDecl *)
                         (**(long **)(in_RDI + 0x40) + (ulong)(local_e8->top & 0xffff) * 0x10)) {
          }
          if ((local_e8->top >> 0x1c == 3) && (local_e8->pos == 0xffffffff)) {
            bVar1 = true;
          }
          if (local_770 == (GCstr *)0x0) {
            if (((local_e8->top >> 0x1c != 1) || ((local_e8->top & 0x100000) != 0)) &&
               (local_e8->top >> 0x1c != 5)) {
              cp_err_token((CPState *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                           in_stack_fffffffffffff83c);
            }
            in_stack_fffffffffffff858->top = CVar5 + 0x80030000;
            if (local_e8->top >> 0x1c == 1) {
              in_stack_fffffffffffff844 = in_stack_fffffffffffff8a4 | 0x80000000;
            }
            else {
              in_stack_fffffffffffff844 = 0;
            }
            in_stack_fffffffffffff858->pos = in_stack_fffffffffffff844;
          }
          else {
            in_stack_fffffffffffff858->top =
                 CVar5 + in_stack_fffffffffffff860 * 0x10000 + 0x90000000;
            in_stack_fffffffffffff858->pos = in_stack_fffffffffffff8a4;
            if (local_770 != (GCstr *)0x0) {
              local_770->marked = local_770->marked | 0x20;
              in_stack_fffffffffffff858->mode = (uint32_t)local_770;
            }
          }
          *(short *)(**(long **)(in_RDI + 0x40) + (ulong)local_104 * 0x10 + 8) =
               (short)in_stack_fffffffffffff854;
          local_104 = in_stack_fffffffffffff854;
        }
        else {
          in_stack_fffffffffffff864 =
               cp_decl_constinit((CPState *)
                                 CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                                 (CType **)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          *(short *)(**(long **)(in_RDI + 0x40) + (ulong)local_104 * 0x10 + 8) =
               (short)in_stack_fffffffffffff864;
          local_770->marked = local_770->marked | 0x20;
          *(uint32_t *)(local_798 + 0xc) = (uint32_t)local_770;
          local_104 = in_stack_fffffffffffff864;
        }
        iVar3 = cp_opt((CPState *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),0);
        if (iVar3 == 0) break;
        cp_decl_reset((CPDecl *)&stack0xfffffffffffff878);
      }
      cp_check((CPState *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               in_stack_fffffffffffff83c);
      in_stack_fffffffffffff848 = local_e8;
    }
    cp_check((CPState *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             in_stack_fffffffffffff83c);
    *(undefined2 *)(**(long **)(in_RDI + 0x40) + (ulong)local_104 * 0x10 + 8) = 0;
    cp_decl_attributes((CPState *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                       (CPDecl *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
    cp_struct_layout((CPState *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff87c,in_stack_fffffffffffff878);
  }
  return CVar2;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}